

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_MeshNgon * __thiscall
ON_MeshComponentRef::MeshNgon(ON_MeshComponentRef *this,ON_MeshNgonBuffer *ngon_buffer)

{
  int iVar1;
  uint mesh_face_index;
  int iVar2;
  ON_MeshFace *fvi;
  ON_MeshNgon *local_20;
  ON_MeshNgon *ngon;
  ON_MeshNgonBuffer *ngon_buffer_local;
  ON_MeshComponentRef *this_local;
  
  local_20 = (ON_MeshNgon *)0x0;
  if ((this->m_mesh != (ON_Mesh *)0x0) && (-1 < (this->m_mesh_ci).m_index)) {
    if ((this->m_mesh_ci).m_type == mesh_ngon) {
      local_20 = ON_Mesh::Ngon(this->m_mesh,(this->m_mesh_ci).m_index);
    }
    else if (((this->m_mesh_ci).m_type == mesh_face) &&
            (iVar1 = (this->m_mesh_ci).m_index,
            iVar2 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_mesh->m_F), iVar1 < iVar2)) {
      mesh_face_index = (this->m_mesh_ci).m_index;
      fvi = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_mesh->m_F,(this->m_mesh_ci).m_index);
      local_20 = ON_MeshNgon::NgonFromMeshFace(ngon_buffer,mesh_face_index,(uint *)fvi);
    }
  }
  return local_20;
}

Assistant:

const class ON_MeshNgon* ON_MeshComponentRef::MeshNgon(
    class ON_MeshNgonBuffer& ngon_buffer
    ) const
{
  const class ON_MeshNgon* ngon = 0;
  if ( 0 != m_mesh && m_mesh_ci.m_index >= 0 )
  {
    if ( ON_COMPONENT_INDEX::mesh_ngon == m_mesh_ci.m_type )
    {
      ngon = m_mesh->Ngon(m_mesh_ci.m_index);
    }
    else if ( ON_COMPONENT_INDEX::mesh_face == m_mesh_ci.m_type && m_mesh_ci.m_index < m_mesh->m_F.Count() )
    {
      ngon = ON_MeshNgon::NgonFromMeshFace(ngon_buffer,(unsigned int)m_mesh_ci.m_index,(const unsigned int*)m_mesh->m_F[m_mesh_ci.m_index].vi);
    }
  }
  return ngon;
}